

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma2_encoder.c
# Opt level: O0

lzma_ret lzma2_encoder_init(lzma_lz_encoder *lz,lzma_allocator *allocator,void *options,
                           lzma_lz_options_conflict *lz_options)

{
  bool local_3d;
  undefined4 *puStack_38;
  lzma_ret ret_;
  lzma_lzma2_coder_conflict *coder;
  lzma_lz_options_conflict *lz_options_local;
  void *options_local;
  lzma_allocator *allocator_local;
  lzma_lz_encoder *lz_local;
  
  if (options == (void *)0x0) {
    lz_local._4_4_ = LZMA_PROG_ERROR;
  }
  else {
    puStack_38 = (undefined4 *)lz->coder;
    if (puStack_38 == (undefined4 *)0x0) {
      puStack_38 = (undefined4 *)lzma_alloc(0x100a8,allocator);
      if (puStack_38 == (undefined4 *)0x0) {
        return LZMA_MEM_ERROR;
      }
      lz->coder = puStack_38;
      lz->code = lzma2_encode;
      lz->end = lzma2_encoder_end;
      lz->options_update = lzma2_encoder_options_update;
      *(undefined8 *)(puStack_38 + 2) = 0;
    }
    memcpy(puStack_38 + 4,options,0x70);
    *puStack_38 = 0;
    *(undefined1 *)(puStack_38 + 0x20) = 1;
    *(undefined1 *)((long)puStack_38 + 0x81) = 0;
    local_3d = true;
    if (*(long *)(puStack_38 + 6) != 0) {
      local_3d = puStack_38[8] == 0;
    }
    *(bool *)((long)puStack_38 + 0x82) = local_3d;
    lz_local._4_4_ =
         lzma_lzma_encoder_create
                   ((void **)(puStack_38 + 2),allocator,(lzma_options_lzma *)(puStack_38 + 4),
                    lz_options);
    if (lz_local._4_4_ == LZMA_OK) {
      if (lz_options->before_size + lz_options->dict_size < 0x10000) {
        lz_options->before_size = 0x10000 - lz_options->dict_size;
      }
      lz_local._4_4_ = LZMA_OK;
    }
  }
  return lz_local._4_4_;
}

Assistant:

static lzma_ret
lzma2_encoder_init(lzma_lz_encoder *lz, const lzma_allocator *allocator,
		const void *options, lzma_lz_options *lz_options)
{
	if (options == NULL)
		return LZMA_PROG_ERROR;

	lzma_lzma2_coder *coder = lz->coder;
	if (coder == NULL) {
		coder = lzma_alloc(sizeof(lzma_lzma2_coder), allocator);
		if (coder == NULL)
			return LZMA_MEM_ERROR;

		lz->coder = coder;
		lz->code = &lzma2_encode;
		lz->end = &lzma2_encoder_end;
		lz->options_update = &lzma2_encoder_options_update;

		coder->lzma = NULL;
	}

	coder->opt_cur = *(const lzma_options_lzma *)(options);

	coder->sequence = SEQ_INIT;
	coder->need_properties = true;
	coder->need_state_reset = false;
	coder->need_dictionary_reset
			= coder->opt_cur.preset_dict == NULL
			|| coder->opt_cur.preset_dict_size == 0;

	// Initialize LZMA encoder
	return_if_error(lzma_lzma_encoder_create(&coder->lzma, allocator,
			&coder->opt_cur, lz_options));

	// Make sure that we will always have enough history available in
	// case we need to use uncompressed chunks. They are used when the
	// compressed size of a chunk is not smaller than the uncompressed
	// size, so we need to have at least LZMA2_COMPRESSED_MAX bytes
	// history available.
	if (lz_options->before_size + lz_options->dict_size < LZMA2_CHUNK_MAX)
		lz_options->before_size
				= LZMA2_CHUNK_MAX - lz_options->dict_size;

	return LZMA_OK;
}